

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

bool __thiscall
Environment::getVariable(Environment *this,string *variable,ResultValue *value,bool applyConversion)

{
  Variables *pVVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  ResultValue local_58;
  byte local_29;
  ResultValue *pRStack_28;
  bool applyConversion_local;
  ResultValue *value_local;
  string *variable_local;
  Environment *this_local;
  
  local_29 = applyConversion;
  pRStack_28 = value;
  value_local = (ResultValue *)variable;
  variable_local = (string *)this;
  pVVar1 = variables_abi_cxx11_(this);
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
          ::count(pVVar1,variable);
  if (sVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((local_29 & 1) == 0) {
      pVVar1 = variables_abi_cxx11_(this);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
               ::at(pVVar1,variable);
      memcpy(pRStack_28,pmVar3,0x28);
    }
    else {
      pVVar1 = variables_abi_cxx11_(this);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
               ::at(pVVar1,variable);
      ResultValue::convertTo(&local_58,pmVar3,this->mEvalMode);
      memcpy(pRStack_28,&local_58,0x28);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Environment::getVariable(std::string variable, ResultValue& value, bool applyConversion) const {
	if (variables().count(variable) > 0) {
		if (applyConversion) {
			value = variables().at(variable).convertTo(mEvalMode);
		} else {
			value = variables().at(variable);
		}

		return true;
	} else {
		return false;
	}
}